

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Vec_Int_t * Gia_ManCollectTopXors(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Int_t *pVVar8;
  Vec_Int_t *pVVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  Vec_Int_t *vPart [2];
  Gia_Obj_t *local_68 [2];
  Vec_Int_t *local_58;
  Vec_Int_t *local_50;
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  
  pVVar8 = p->vCos;
  if (pVVar8->nSize < 1) {
LAB_001f534f:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar4 = *pVVar8->pArray;
  if (((long)iVar4 < 0) || (iVar10 = p->nObjs, iVar10 <= iVar4)) {
LAB_001f5330:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar2 = p->pObjs;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar6->pArray = piVar7;
  local_58 = pVVar6;
  if (pVVar8->nSize == 1) {
    uVar5 = (uint)*(undefined8 *)(pGVar2 + iVar4);
    pGVar3 = pGVar2 + iVar4 + -(ulong)(uVar5 & 0x1fffffff);
    if ((uVar5 >> 0x1d & 1) == 0) {
      if ((pGVar3 < pGVar2) || (pGVar2 + iVar10 <= pGVar3)) {
LAB_001f5311:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(pVVar6,(int)((ulong)((long)pGVar3 - (long)pGVar2) >> 2) * -0x55555555);
    }
    else {
      Gia_ManCollectTopXors_rec(p,pGVar3,pVVar6);
    }
  }
  else {
    pVVar8 = p->vCos;
    if (0 < pVVar8->nSize) {
      lVar12 = 0;
      do {
        iVar4 = pVVar8->pArray[lVar12];
        if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_001f5330;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        uVar5 = *(uint *)(p->pObjs + iVar4) & 0x1fffffff;
        iVar10 = iVar4 - uVar5;
        if (iVar10 != 0 && (int)uVar5 <= iVar4) {
          Vec_IntPush(pVVar6,iVar10);
        }
        lVar12 = lVar12 + 1;
        pVVar8 = p->vCos;
      } while (lVar12 < pVVar8->nSize);
    }
  }
  Gia_ManDupDemiterOrderXors(p,pVVar6);
  iVar4 = pVVar6->nSize;
  if (1 < iVar4) {
    piVar7 = pVVar6->pArray;
    iVar10 = -1;
    lVar12 = 0;
    do {
      iVar1 = piVar7[lVar12];
      piVar7[lVar12] = piVar7[iVar4 + iVar10];
      piVar7[pVVar6->nSize + iVar10] = iVar1;
      lVar12 = lVar12 + 1;
      iVar4 = pVVar6->nSize;
      iVar10 = iVar10 + -1;
    } while (lVar12 < iVar4 / 2);
  }
  Gia_ManCleanMark01(p);
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar8->pArray = piVar7;
  local_48 = pVVar8;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar9->pArray = piVar7;
  local_50 = pVVar9;
  local_40 = pVVar9;
  if (0 < pVVar6->nSize) {
    lVar12 = 0;
    do {
      iVar4 = pVVar6->pArray[lVar12];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_001f5330;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar4;
      iVar4 = Gia_ObjRecognizeExor(pGVar2,local_68,local_68 + 1);
      if (iVar4 == 0) {
        local_68[1] = p->pObjs;
        local_68[0] = pGVar2;
      }
      else {
        local_68[0] = (Gia_Obj_t *)((ulong)local_68[0] & 0xfffffffffffffffe);
        local_68[1] = (Gia_Obj_t *)((ulong)local_68[1] & 0xfffffffffffffffe);
      }
      uVar5 = Gia_ManDecideWhereToAdd(p,&local_48,local_68);
      pGVar2 = local_68[uVar5];
      pGVar3 = p->pObjs;
      if ((pGVar2 < pGVar3) || (pGVar3 + p->nObjs <= pGVar2)) goto LAB_001f5311;
      Vec_IntPush(pVVar8,(int)((ulong)((long)pGVar2 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar2 = local_68[uVar5 ^ 1];
      pGVar3 = p->pObjs;
      if ((pGVar2 < pGVar3) || (pGVar3 + p->nObjs <= pGVar2)) goto LAB_001f5311;
      Vec_IntPush(local_50,(int)((ulong)((long)pGVar2 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar2 = local_68[uVar5];
      pGVar3 = p->pObjs;
      if ((pGVar2 < pGVar3) || (pGVar3 + p->nObjs <= pGVar2)) goto LAB_001f5311;
      Gia_ManSetMark0Dfs_rec(p,(int)((ulong)((long)pGVar2 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar2 = local_68[uVar5 ^ 1];
      pGVar3 = p->pObjs;
      if ((pGVar2 < pGVar3) || (pGVar3 + p->nObjs <= pGVar2)) goto LAB_001f5311;
      Gia_ManSetMark1Dfs_rec(p,(int)((ulong)((long)pGVar2 - (long)pGVar3) >> 2) * -0x55555555);
      lVar12 = lVar12 + 1;
      pVVar6 = local_58;
    } while (lVar12 < local_58->nSize);
  }
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (int *)0x0;
  }
  free(pVVar6);
  Gia_ManCleanMark01(p);
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar6 = local_50;
  pVVar9->pArray = piVar7;
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      if (pVVar6->nSize <= lVar12) goto LAB_001f534f;
      iVar4 = pVVar6->pArray[lVar12];
      Vec_IntPush(pVVar9,pVVar8->pArray[lVar12]);
      Vec_IntPush(pVVar9,iVar4);
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar8->nSize);
  }
  if (pVVar8->pArray != (int *)0x0) {
    free(pVVar8->pArray);
    pVVar8->pArray = (int *)0x0;
  }
  free(pVVar8);
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (int *)0x0;
  }
  free(pVVar6);
  uVar5 = pVVar9->nSize;
  if (1 < (int)uVar5) {
    piVar7 = pVVar9->pArray;
    uVar11 = uVar5 >> 1;
    uVar13 = 0;
    do {
      uVar5 = uVar5 - 1;
      iVar4 = piVar7[uVar13];
      piVar7[uVar13] = piVar7[(int)uVar5];
      piVar7[(int)uVar5] = iVar4;
      uVar13 = uVar13 + 1;
    } while (uVar11 != uVar13);
  }
  return pVVar9;
}

Assistant:

Vec_Int_t * Gia_ManCollectTopXors( Gia_Man_t * p )
{
    int i, iObj, iObj2, fFlip, Count1 = 0;
    Vec_Int_t * vXors, * vPart[2], * vOrder; 
    Gia_Obj_t * pFan[2], * pObj = Gia_ManCo(p, 0);
    vXors = Vec_IntAlloc( 100 );
    if ( Gia_ManCoNum(p) == 1 )
    {
        if ( Gia_ObjFaninC0(pObj) )
            Gia_ManCollectTopXors_rec( p, Gia_ObjFanin0(pObj), vXors );
        else
            Vec_IntPush( vXors, Gia_ObjId(p, Gia_ObjFanin0(pObj)) );
    }
    else
    {
        Gia_ManForEachCo( p, pObj, i )
            if ( Gia_ObjFaninId0p(p, pObj) > 0 )
                Vec_IntPush( vXors, Gia_ObjFaninId0p(p, pObj) );
    }
    // order by support size
    Gia_ManDupDemiterOrderXors( p, vXors );
    //Vec_IntPrint( vXors );
    Vec_IntReverseOrder( vXors ); // from MSB to LSB
    // divide into groups
    Gia_ManCleanMark01(p);
    vPart[0] = Vec_IntAlloc( 100 );
    vPart[1] = Vec_IntAlloc( 100 );
    Gia_ManForEachObjVec( vXors, p, pObj, i )
    {
        int fCompl = 0;
        if ( !Gia_ObjRecognizeExor(pObj, &pFan[0], &pFan[1]) )
            pFan[0] = pObj, pFan[1] = Gia_ManConst0(p), Count1++;
        else
        {
            fCompl ^= Gia_IsComplement(pFan[0]);
            fCompl ^= Gia_IsComplement(pFan[1]);
            pFan[0] = Gia_Regular(pFan[0]);
            pFan[1] = Gia_Regular(pFan[1]);
        }
        fFlip = Gia_ManDecideWhereToAdd( p, vPart, pFan );
        Vec_IntPush( vPart[0], Gia_ObjId(p, pFan[fFlip]) );
        Vec_IntPush( vPart[1], Gia_ObjId(p, pFan[!fFlip]) );
        Gia_ManSetMark0Dfs_rec( p, Gia_ObjId(p, pFan[fFlip]) );
        Gia_ManSetMark1Dfs_rec( p, Gia_ObjId(p, pFan[!fFlip]) );
    }
    //printf( "Detected %d single-output XOR miters and %d other miters.\n", Vec_IntSize(vXors) - Count1, Count1 );
    Vec_IntFree( vXors );
    Gia_ManCleanMark01(p);
    // create new order
    vOrder = Vec_IntAlloc( 100 );
    Vec_IntForEachEntryTwo( vPart[0], vPart[1], iObj, iObj2, i )
        Vec_IntPushTwo( vOrder, iObj, iObj2 );
    Vec_IntFree( vPart[0] );
    Vec_IntFree( vPart[1] );
    Vec_IntReverseOrder( vOrder ); // from LSB to MSB
    //Vec_IntPrint( vOrder );
    return vOrder;
}